

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_util.c
# Opt level: O0

void CMint_free_attr_list(CManager cm,attr_list l,char *file,int line)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  uint in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  CManager unaff_retaddr;
  timespec ts;
  int count;
  timespec local_30;
  uint local_20;
  uint local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = attr_list_ref_count(in_RSI);
  iVar1 = CMtrace_val[8];
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(unaff_retaddr,(CMTraceType)((ulong)in_RDI >> 0x20));
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      __stream = *(FILE **)(in_RDI + 0x120);
      _Var2 = getpid();
      pVar3 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_30);
      fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_30.tv_sec,local_30.tv_nsec);
    }
    fprintf(*(FILE **)(in_RDI + 0x120),"Freeing attr list %p at %s:%d, ref count was %d\n",local_10,
            local_18,(ulong)local_1c,(ulong)local_20);
  }
  fflush(*(FILE **)(in_RDI + 0x120));
  free_attr_list(local_10);
  return;
}

Assistant:

extern void 
CMint_free_attr_list(CManager cm, attr_list l, char *file, int line)
{
    int count = attr_list_ref_count(l);
    (void)cm;
    CMtrace_out(cm, CMAttrVerbose, "Freeing attr list %p at %s:%d, ref count was %d\n", 
		l, file, line, count);
    free_attr_list(l);
}